

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WScriptJsrt.h
# Opt level: O0

LPCWSTR WScriptJsrt::ConvertErrorCodeToMessage(JsErrorCode errorCode)

{
  PAL_FILE *pPVar1;
  char16_t *pcStack_10;
  JsErrorCode errorCode_local;
  
  if (errorCode == JsErrorInvalidArgument) {
    pcStack_10 = L"TypeError: InvalidArgument";
  }
  else if (errorCode == JsErrorNullArgument) {
    pcStack_10 = L"TypeError: NullArgument";
  }
  else if (errorCode == JsErrorInExceptionState) {
    pcStack_10 = L"ErrorInExceptionState";
  }
  else if (errorCode == JsErrorBadSerializedScript) {
    pcStack_10 = L"ErrorBadSerializedScript ";
  }
  else if (errorCode == JsErrorArgumentNotObject) {
    pcStack_10 = L"TypeError: ArgumentNotAnObject";
  }
  else if (errorCode == JsErrorOutOfMemory) {
    pcStack_10 = L"OutOfMemory";
  }
  else if (errorCode == JsErrorScriptException) {
    pcStack_10 = L"ScriptError";
  }
  else if (errorCode == JsErrorScriptCompile) {
    pcStack_10 = L"SyntaxError";
  }
  else if (errorCode == JsErrorFatal) {
    pcStack_10 = L"FatalError";
  }
  else {
    pPVar1 = PAL_get_stderr(0);
    PAL_fprintf(pPVar1,"ASSERTION (%s, line %d) %s %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/bin/ch/WScriptJsrt.h"
                ,0x61,"false","Unexpected JsErrorCode");
    pPVar1 = PAL_get_stderr(0);
    PAL_fflush(pPVar1);
    DebugBreak();
    pcStack_10 = (char16_t *)0x0;
  }
  return pcStack_10;
}

Assistant:

static LPCWSTR ConvertErrorCodeToMessage(JsErrorCode errorCode)
    {
        switch (errorCode)
        {
        case (JsErrorCode::JsErrorInvalidArgument) :
            return _u("TypeError: InvalidArgument");
        case (JsErrorCode::JsErrorNullArgument) :
            return _u("TypeError: NullArgument");
        case (JsErrorCode::JsErrorArgumentNotObject) :
            return _u("TypeError: ArgumentNotAnObject");
        case (JsErrorCode::JsErrorOutOfMemory) :
            return _u("OutOfMemory");
        case (JsErrorCode::JsErrorScriptException) :
            return _u("ScriptError");
        case (JsErrorCode::JsErrorScriptCompile) :
            return _u("SyntaxError");
        case (JsErrorCode::JsErrorFatal) :
            return _u("FatalError");
        case (JsErrorCode::JsErrorInExceptionState) :
            return _u("ErrorInExceptionState");
        case (JsErrorCode::JsErrorBadSerializedScript):
            return _u("ErrorBadSerializedScript ");
        default:
            AssertMsg(false, "Unexpected JsErrorCode");
            return nullptr;
        }
    }